

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BERDecode.cpp
# Opt level: O2

vector<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
SortableOIDType::generateSortingMap
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          SortableOIDType *this)

{
  pointer puVar1;
  size_t sVar2;
  int max_len;
  pointer buf;
  long item;
  unsigned_long local_40;
  unsigned_long local_38;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            (__return_storage_ptr__,
             (long)(this->super_OIDType).data.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->super_OIDType).data.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start);
  puVar1 = (this->super_OIDType).data.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  buf = puVar1 + 1;
  for (max_len = ~(uint)puVar1 +
                 *(int *)&(this->super_OIDType).data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish; 0 < max_len;
      max_len = max_len - (int)sVar2) {
    sVar2 = decode_ber_longform_integer(buf,(long *)&local_38,max_len);
    local_40 = local_38;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
              (__return_storage_ptr__,&local_40);
    buf = buf + sVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

const std::vector<unsigned long> SortableOIDType::generateSortingMap() const {
    auto map = std::vector<unsigned long>();

    // maybe anice midway between speed and size?
    map.reserve(this->data.size() * 1);

    const uint8_t* ptr = this->data.data();

    ptr += 1; // skip to start of interesting differences
    int i = this->data.size() - 1;

    while(i > 0){
        long item;
        size_t len = decode_ber_longform_integer(ptr, &item, i);
        ptr += len; i -= len;
        map.push_back(item);
    }

    return map;
}